

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

bool __thiscall mnf::CartesianProduct::isSameTopology(CartesianProduct *this,Manifold *other)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  undefined4 extraout_var_02;
  long local_40;
  ulong local_28;
  size_t i;
  Manifold *other_local;
  CartesianProduct *this_local;
  
  if (other == (Manifold *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&Manifold::typeinfo,&typeinfo,0);
  }
  if (local_40 != 0) {
    iVar1 = (*(this->super_Manifold)._vptr_Manifold[7])();
    iVar2 = (*other->_vptr_Manifold[7])();
    if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
      local_28 = 0;
      while( true ) {
        iVar1 = (*(this->super_Manifold)._vptr_Manifold[7])();
        if (CONCAT44(extraout_var_01,iVar1) <= local_28) {
          return true;
        }
        this_00 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                     ::operator[](&this->subManifolds_,local_28);
        peVar4 = std::
                 __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        iVar1 = (*other->_vptr_Manifold[8])(other,local_28);
        uVar3 = (*peVar4->_vptr_Manifold[10])(peVar4,CONCAT44(extraout_var_02,iVar1));
        if ((uVar3 & 1) == 0) break;
        local_28 = local_28 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool CartesianProduct::isSameTopology(const Manifold& other) const
{
  if (dynamic_cast<const CartesianProduct*>(&other) &&
      numberOfSubManifolds() == other.numberOfSubManifolds())
  {
    for (size_t i = 0; i < numberOfSubManifolds(); ++i)
    {
      if (!subManifolds_[i]->isSameTopology(other(i))) return false;
    }
    return true;
  }
  else
    return false;
}